

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.cpp
# Opt level: O3

void __thiscall
stateObservation::IndexedMatrixArray::writeInFile(IndexedMatrixArray *this,char *filename)

{
  uint uVar1;
  char cVar2;
  _Map_pointer ppMVar3;
  ulong uVar4;
  reference pMVar5;
  Index IVar6;
  _Elt_pointer pMVar7;
  _Map_pointer ppMVar8;
  _Elt_pointer pMVar9;
  _Elt_pointer pMVar10;
  _Elt_pointer pMVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ofstream f;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ofstream *)&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)filename);
  ppMVar3 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppMVar8 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pMVar7 = (this->v_).
           super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pMVar10 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first;
  lVar12 = ((long)pMVar7 - (long)pMVar10 >> 3) * -0x5555555555555555;
  pMVar11 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pMVar9 = (this->v_).
           super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  if ((int)((ulong)((long)pMVar9 - (long)pMVar11) >> 3) * -0x55555555 +
      (int)lVar12 +
      ((int)((ulong)((long)ppMVar3 - (long)ppMVar8) >> 3) - (uint)(ppMVar3 != (_Map_pointer)0x0)) *
      0x15 == 0) {
LAB_0013e7b4:
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  uVar4 = (ulong)this->k_;
  uVar14 = 0;
  if ((((long)ppMVar3 - (long)ppMVar8 >> 3) - (ulong)(ppMVar3 != (_Map_pointer)0x0)) * 0x15 + lVar12
      != ((long)pMVar9 - (long)pMVar11 >> 3) * 0x5555555555555555) {
    uVar14 = uVar4;
  }
  while( true ) {
    lVar12 = ((long)pMVar9 - (long)pMVar11 >> 3) * -0x5555555555555555 +
             ((long)pMVar7 - (long)pMVar10 >> 3) * -0x5555555555555555 +
             (((long)ppMVar3 - (long)ppMVar8 >> 3) + -1 + (ulong)(ppMVar3 == (_Map_pointer)0x0)) *
             0x15;
    uVar4 = (ulong)(uint)((int)uVar4 + -1 + (int)lVar12);
    if (lVar12 == 0) {
      uVar4 = 0;
    }
    if (uVar4 < uVar14) goto LAB_0013e7b4;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    ppMVar3 = (this->v_).
              super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    lVar12 = ((long)(this->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(this->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
             ((long)(this->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(this->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
             (((long)ppMVar3 -
               (long)(this->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
             (ulong)(ppMVar3 == (_Map_pointer)0x0)) * 0x15;
    if (lVar12 == 0) break;
    uVar1 = this->k_;
    if (((uint)uVar14 < uVar1) || (lVar12 + (ulong)uVar1 <= uVar14)) break;
    pMVar5 = std::
             _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
             ::operator[](&(this->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start,(ulong)((uint)uVar14 - uVar1));
    IVar6 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    if (0 < IVar6) {
      lVar12 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols;
      lVar15 = 0;
      do {
        if (0 < lVar12) {
          lVar13 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
            lVar12 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_rows;
            if ((lVar12 <= lVar15) ||
               ((pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                .m_cols <= lVar13)) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                           );
            }
            std::ostream::_M_insert<double>
                      ((pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data[lVar12 * lVar13 + lVar15]);
            lVar13 = lVar13 + 1;
            lVar12 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_cols;
          } while (lVar13 < lVar12);
          IVar6 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_rows;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < IVar6);
    }
    cVar2 = (char)(ofstream *)&local_230;
    std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    ppMVar3 = (this->v_).
              super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppMVar8 = (this->v_).
              super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    pMVar7 = (this->v_).
             super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pMVar10 = (this->v_).
              super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first;
    pMVar9 = (this->v_).
             super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    pMVar11 = (this->v_).
              super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar4 = (ulong)this->k_;
    uVar14 = uVar14 + 1;
  }
  __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x9b,"void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
}

Assistant:

void IndexedMatrixArray::writeInFile(const char * filename)
    {
    	std::ofstream f;

      f.open(filename);

      if (size()>0)
      {

        for (size_t k=getFirstIndex();k<=getLastIndex();++k)
        {

            f << k;

            Matrix & m = operator[](k);

            for (int i = 0 ; i< m.rows(); ++i)
            {
              for (int j = 0 ; j< m.cols(); ++j)
              {
            		f << " "<< m(i,j);
              }
            }

            f << std::endl;
        }
      }
    }